

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void makeRksTable(void)

{
  int local_14;
  int local_10;
  int32_t KR;
  int32_t block;
  int32_t fnum8;
  
  for (KR = 0; KR < 2; KR = KR + 1) {
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
        if (local_14 == 0) {
          rksTable[KR][local_10][0] = local_10 >> 1;
        }
        else {
          rksTable[KR][local_10][local_14] = local_10 * 2 + KR;
        }
      }
    }
  }
  return;
}

Assistant:

static void
makeRksTable (void)
{

  int32_t fnum8, block, KR;

  for (fnum8 = 0; fnum8 < 2; fnum8++)
    for (block = 0; block < 8; block++)
      for (KR = 0; KR < 2; KR++)
      {
        if (KR != 0)
          rksTable[fnum8][block][KR] = (block << 1) + fnum8;
        else
          rksTable[fnum8][block][KR] = block >> 1;
      }
}